

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::RootRelease(Recycler *this,void *obj,uint *count)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  PinRecord *pPVar6;
  StackBackTrace *stackBackTrace;
  undefined8 *in_FS_OFFSET;
  
  BVar4 = IsValidObject(this,obj,0);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x269,"(this->IsValidObject(obj))","this->IsValidObject(obj)");
    if (!bVar3) goto LAB_002862e7;
    *puVar1 = 0;
  }
  if (this->transientPinnedObject != obj) {
    pPVar6 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             ::TryGetReference(&this->pinnedObjectMap,obj);
    if (pPVar6 == (PinRecord *)0x0) {
      if (count != (uint *)0x0) {
        *count = 0xffffffff;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x288,"(false)","false");
      if (!bVar3) {
LAB_002862e7:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    else {
      uVar5 = pPVar6->refCount - 1;
      pPVar6->refCount = uVar5;
      if (count != (uint *)0x0) {
        *count = uVar5;
      }
      if (uVar5 == 0) {
        StackBackTraceNode::DeleteAll<Memory::NoCheckHeapAllocator>
                  ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,&pPVar6->stackBackTraces)
        ;
        pPVar6->stackBackTraces = (StackBackTraceNode *)0x0;
        if (this->hasPendingConcurrentFindRoot == true) {
          this->hasPendingUnpinnedObject = true;
        }
        else {
          SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
          ::Remove(&this->pinnedObjectMap,obj);
        }
        goto LAB_002862d1;
      }
      if (this->recyclerFlagsTable->LeakStackTrace == true) {
        stackBackTrace =
             StackBackTrace::Capture<Memory::NoCheckHeapAllocator>
                       ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0,0x1e);
        StackBackTraceNode::Prepend<Memory::NoCheckHeapAllocator>
                  ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,&pPVar6->stackBackTraces,
                   stackBackTrace);
        return;
      }
    }
    return;
  }
  this->transientPinnedObject = (void *)0x0;
  if (count != (uint *)0x0) {
    pPVar6 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             ::TryGetReference(&this->pinnedObjectMap,obj);
    if (pPVar6 == (PinRecord *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = pPVar6->refCount;
    }
    *count = uVar5;
  }
  if (this->recyclerFlagsTable->LeakStackTrace == true) {
    StackBackTrace::Delete<Memory::NoCheckHeapAllocator>
              (this->transientPinnedObjectStackBackTrace,
               (NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance);
  }
LAB_002862d1:
  CollectNow<(Memory::CollectionFlags)8320>(this);
  return;
}

Assistant:

void
Recycler::RootRelease(void* obj, uint *count)
{
    Assert(this->IsValidObject(obj));

    if (transientPinnedObject == obj)
    {
        transientPinnedObject = nullptr;

        if (count != nullptr)
        {
            PinRecord *refCount = pinnedObjectMap.TryGetReference(obj);
            *count = (refCount != nullptr) ? *refCount : 0;
        }

#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
        if (GetRecyclerFlagsTable().LeakStackTrace)
        {
            transientPinnedObjectStackBackTrace->Delete(&NoCheckHeapAllocator::Instance);
        }
#endif
#endif
    }
    else
    {
        PinRecord *refCount = pinnedObjectMap.TryGetReference(obj);
        if (refCount == nullptr)
        {
            if (count != nullptr)
            {
                *count = (uint)-1;
            }
            // REVIEW: throw if not found
            Assert(false);
            return;
        }

        uint newRefCount = (--(*refCount));

        if (count != nullptr)
        {
            *count = newRefCount;
        }

        if (newRefCount != 0)
        {
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
            if (GetRecyclerFlagsTable().LeakStackTrace)
            {
                StackBackTraceNode::Prepend(&NoCheckHeapAllocator::Instance, refCount->stackBackTraces,
                    StackBackTrace::Capture(&NoCheckHeapAllocator::Instance));
            }
#endif
#endif
            return;
        }
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
        StackBackTraceNode::DeleteAll(&NoCheckHeapAllocator::Instance, refCount->stackBackTraces);
        refCount->stackBackTraces = nullptr;
#endif
#endif
#if ENABLE_CONCURRENT_GC
        // Don't delete the entry if we are in concurrent find root state
        // We will delete it later on in-thread find root
        if (this->hasPendingConcurrentFindRoot)
        {
            this->hasPendingUnpinnedObject = true;
        }
        else
#endif
        {
            pinnedObjectMap.Remove(obj);
        }

        RECYCLER_PERF_COUNTER_DEC(PinnedObject);
    }

    // Any time a root is removed during a GC, it indicates that an exhaustive
    // collection is likely going to have work to do so trigger an exhaustive
    // candidate GC to indicate this fact
    this->CollectNow<CollectExhaustiveCandidate>();
}